

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O3

ArrayBufferDetachedStateBase * __thiscall
Js::ExternalArrayBuffer::CreateDetachedState
          (ExternalArrayBuffer *this,RefCountedBuffer *buffer,uint32 bufferLength)

{
  HeapAllocator *alloc;
  ArrayBufferDetachedStateBase *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])&ExternalArrayBufferDetachedState::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_5dae254;
  data.filename._0_4_ = 0x4f2;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_50);
  this_00 = (ArrayBufferDetachedStateBase *)new<Memory::HeapAllocator>(0x20,alloc,0x2ff150);
  ExternalArrayBufferDetachedState::ExternalArrayBufferDetachedState
            ((ExternalArrayBufferDetachedState *)this_00,buffer,bufferLength);
  return this_00;
}

Assistant:

ArrayBufferDetachedStateBase* ExternalArrayBuffer::CreateDetachedState(RefCountedBuffer* buffer, DECLSPEC_GUARD_OVERFLOW uint32 bufferLength)
    {
        return HeapNew(ExternalArrayBufferDetachedState, buffer, bufferLength);
    }